

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O2

void StringFormatter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*>
     ::format(ostream *os,char *fmt)

{
  char cVar1;
  runtime_error *this;
  long lVar2;
  
  do {
    cVar1 = *fmt;
    if (cVar1 == '%') {
      cVar1 = '%';
      lVar2 = 2;
      if (fmt[1] != '%') {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"not enough arguments to format");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      lVar2 = 1;
      if (cVar1 == '\0') {
        return;
      }
    }
    fmt = fmt + lVar2;
    std::operator<<(os,cVar1);
  } while( true );
}

Assistant:

static void format(std::ostream&os, const char *fmt) 
    {
        const char *p= fmt;
        while (*p) {
            if (*p=='%') {
                p++;
                if (*p=='%') {
                    os << *p++;
                }
                else {
                    throw std::runtime_error("not enough arguments to format");
                }
            }
            else {
                os << *p++;
            }
        }
    }